

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

int __thiscall userinfo_t::PlayerClassChanged(userinfo_t *this,char *classname)

{
  int intval;
  FBaseCVar **ppFVar1;
  FName local_14;
  
  intval = D_PlayerClassToInt(classname);
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_14);
  FIntCVar::operator=((FIntCVar *)*ppFVar1,intval);
  return intval;
}

Assistant:

int userinfo_t::PlayerClassChanged(const char *classname)
{
	int classnum = D_PlayerClassToInt(classname);
	*static_cast<FIntCVar *>((*this)[NAME_PlayerClass]) = classnum;
	return classnum;
}